

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

char __thiscall helics::Input::getValueChar(Input *this)

{
  char cVar1;
  bool bVar2;
  DataType baseType;
  double dVar3;
  char V;
  data_view dv;
  string local_50;
  data_view local_30;
  
  checkAndGetFedUpdate(&local_30,this);
  if (local_30.dblock._M_len == 0) goto LAB_001fbf20;
  baseType = this->injectionType;
  if (baseType == HELICS_UNKNOWN) {
    loadSourceInformation(this);
    baseType = this->injectionType;
  }
  if (((0x19 < (uint)baseType) ||
      ((0x2000201U >> (baseType & (HELICS_JSON|HELICS_DOUBLE)) & 1) == 0)) &&
     (baseType != HELICS_ANY)) {
    local_50._M_dataplus._M_p = (pointer)0x8000000000000000;
    if (baseType == HELICS_DOUBLE) {
      dVar3 = doubleExtractAndConvert(&local_30,&this->inputUnits,&this->outputUnits);
      local_50._M_dataplus._M_p = (pointer)(long)dVar3;
    }
    else {
      valueExtract<long>(&local_30,baseType,(long *)&local_50);
    }
    if (this->changeDetectionEnabled == true) {
      bVar2 = changeDetected(&this->lastValue,(int64_t)local_50._M_dataplus._M_p,this->delta);
      if (!bVar2) goto LAB_001fbf20;
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->lastValue,(long *)&local_50);
    goto LAB_001fbf20;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  helics::valueExtract(&local_30,baseType,&local_50);
  if (this->changeDetectionEnabled == true) {
    bVar2 = changeDetected(&this->lastValue,&local_50,this->delta);
    if (bVar2) goto LAB_001fbf09;
  }
  else {
LAB_001fbf09:
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->lastValue,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
LAB_001fbf20:
  helics::valueExtract(&this->lastValue,(char *)&local_50);
  this->hasUpdate = false;
  cVar1 = (char)local_50._M_dataplus._M_p;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return cVar1;
}

Assistant:

char Input::getValueChar()
{
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if ((injectionType == DataType::HELICS_STRING) || (injectionType == DataType::HELICS_ANY) ||
            (injectionType == DataType::HELICS_CHAR) ||
            (injectionType == DataType::HELICS_CUSTOM)) {
            std::string out;
            valueExtract(dv, injectionType, out);
            if (changeDetectionEnabled) {
                if (changeDetected(lastValue, out, delta)) {
                    lastValue = out;
                }
            } else {
                lastValue = out;
            }
        } else {
            int64_t out = invalidValue<int64_t>();
            if (injectionType == helics::DataType::HELICS_DOUBLE) {
                out = static_cast<int64_t>(doubleExtractAndConvert(dv, inputUnits, outputUnits));
            } else {
                valueExtract(dv, injectionType, out);
            }
            if (changeDetectionEnabled) {
                if (changeDetected(lastValue, out, delta)) {
                    lastValue = out;
                }
            } else {
                lastValue = out;
            }
        }
    }
    char V;
    valueExtract(lastValue, V);
    hasUpdate = false;
    return V;
}